

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.h
# Opt level: O2

NBestEncodeResult * __thiscall
sentencepiece::ModelInterface::NBestEncode
          (NBestEncodeResult *__return_storage_ptr__,ModelInterface *this,string_view normalized,
          int nbest_size)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  Die local_9;
  
  iVar1 = logging::GetMinLogLevel();
  if (iVar1 < 3) {
    local_9.die_ = false;
    pcVar2 = logging::BaseName("third_party/sentencepiece/src/model_interface.h");
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x57);
    poVar3 = std::operator<<(poVar3,") ");
    poVar3 = std::operator<<(poVar3,"LOG(");
    poVar3 = std::operator<<(poVar3,"ERROR");
    poVar3 = std::operator<<(poVar3,") ");
    std::operator<<(poVar3,"Not implemented.");
    error::Die::~Die(&local_9);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

virtual NBestEncodeResult NBestEncode(absl::string_view normalized,
                                        int nbest_size) const {
    LOG(ERROR) << "Not implemented.";
    return NBestEncodeResult();
  }